

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hal_h264e_vepu580.c
# Opt level: O0

MPP_RET vepu580_h264e_save_pass1_patch(HalVepu580RegSet *regs,HalH264eVepu580Ctx *ctx)

{
  uint uVar1;
  uint uVar2;
  RK_U32 RVar3;
  RK_S32 height_align;
  RK_S32 width_align;
  HalH264eVepu580Ctx *ctx_local;
  HalVepu580RegSet *regs_local;
  
  uVar1 = (ctx->cfg->prep).width + 0x3fU & 0xffffffc0;
  uVar2 = (ctx->cfg->prep).height + 0xfU & 0xfffffff0;
  if ((ctx->buf_pass1 == (MppBuffer)0x0) &&
     (mpp_buffer_get_with_tag
                ((MppBufferGroup)0x0,&ctx->buf_pass1,(long)((int)(uVar1 * uVar2 * 3) / 2),
                 "hal_h264e_vepu580","vepu580_h264e_save_pass1_patch"),
     ctx->buf_pass1 == (MppBuffer)0x0)) {
    _mpp_log_l(2,"hal_h264e_vepu580","buf_pass1 malloc fail, debreath invaild",(char *)0x0);
    regs_local._4_4_ = MPP_NOK;
  }
  else {
    (regs->reg_base).enc_pic =
         (anon_struct_4_12_9a467a88_for_enc_pic)((uint)(regs->reg_base).enc_pic & 0xfffffffb | 4);
    RVar3 = mpp_buffer_get_fd_with_caller(ctx->buf_pass1,"vepu580_h264e_save_pass1_patch");
    (regs->reg_base).rfpw_h_addr = RVar3;
    (regs->reg_base).rfpw_b_addr = (regs->reg_base).rfpw_h_addr;
    (regs->reg_base).enc_pic =
         (anon_struct_4_12_9a467a88_for_enc_pic)
         ((uint)(regs->reg_base).enc_pic & 0x7fffffff | 0x80000000);
    mpp_dev_multi_offset_update(ctx->offsets,0xa4,uVar1 * uVar2);
    (regs->reg_base).sli_splt =
         (anon_struct_4_7_46df3407_for_sli_splt)((uint)(regs->reg_base).sli_splt & 0xfffffffe);
    (regs->reg_base).enc_pic =
         (anon_struct_4_12_9a467a88_for_enc_pic)((uint)(regs->reg_base).enc_pic & 0xbfffffff);
    regs_local._4_4_ = MPP_OK;
  }
  return regs_local._4_4_;
}

Assistant:

static MPP_RET vepu580_h264e_save_pass1_patch(HalVepu580RegSet *regs, HalH264eVepu580Ctx *ctx)
{
    RK_S32 width_align = MPP_ALIGN(ctx->cfg->prep.width, 64);
    RK_S32 height_align = MPP_ALIGN(ctx->cfg->prep.height, 16);

    if (NULL == ctx->buf_pass1) {
        mpp_buffer_get(NULL, &ctx->buf_pass1, width_align * height_align * 3 / 2);
        if (!ctx->buf_pass1) {
            mpp_err("buf_pass1 malloc fail, debreath invaild");
            return MPP_NOK;
        }
    }

    regs->reg_base.enc_pic.cur_frm_ref = 1;
    regs->reg_base.rfpw_h_addr = mpp_buffer_get_fd(ctx->buf_pass1);
    regs->reg_base.rfpw_b_addr = regs->reg_base.rfpw_h_addr;
    regs->reg_base.enc_pic.rec_fbc_dis = 1;

    mpp_dev_multi_offset_update(ctx->offsets, 164, width_align * height_align);

    /* NOTE: disable split to avoid lowdelay slice output */
    regs->reg_base.sli_splt.sli_splt = 0;
    regs->reg_base.enc_pic.slen_fifo = 0;

    return MPP_OK;
}